

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O0

void __thiscall ExecutionEngine::i_bipush(ExecutionEngine *this)

{
  Value operand;
  VMStack *this_00;
  Frame *this_01;
  u1 *puVar1;
  Value value;
  u1 byte;
  u1 *code;
  Frame *topFrame;
  VMStack *stackFrame;
  ExecutionEngine *this_local;
  
  this_00 = VMStack::getInstance();
  this_01 = VMStack::getTopFrame(this_00);
  puVar1 = Frame::getCode(this_01,this_01->pc);
  operand.data.longValue._4_4_ = value.type;
  operand.data.intValue = (int)(char)puVar1[1];
  operand.printType = BYTE;
  operand.type = INT;
  Frame::pushIntoOperandStack(this_01,operand);
  this_01->pc = this_01->pc + 2;
  return;
}

Assistant:

void ExecutionEngine::i_bipush() {
    VMStack &stackFrame = VMStack::getInstance();
    Frame *topFrame = stackFrame.getTopFrame();
    u1 *code = topFrame->getCode(topFrame->pc);

    u1 byte = code[1];

    Value value;
    value.printType = ValueType::BYTE;
    value.type = ValueType::INT;
    value.data.intValue = (int32_t) (int8_t) byte; // convertendo para inteiro e estendendo o sinal

    topFrame->pushIntoOperandStack(value);

    topFrame->pc += 2;
}